

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void page_size_init_aarch64(uc_struct_conflict2 *uc)

{
  ulong uVar1;
  
  if (uc->qemu_host_page_size == 0) {
    uc->qemu_host_page_size = uc->qemu_real_host_page_size;
  }
  uVar1 = (ulong)-(int)uc->init_target_page->mask;
  if (uc->qemu_host_page_size < uVar1) {
    uc->qemu_host_page_size = uVar1;
  }
  return;
}

Assistant:

void page_size_init(struct uc_struct *uc)
{
    /* NOTE: we can always suppose that qemu_host_page_size >=
       TARGET_PAGE_SIZE */
    if (uc->qemu_host_page_size == 0) {
        uc->qemu_host_page_size = uc->qemu_real_host_page_size;
    }
    if (uc->qemu_host_page_size < TARGET_PAGE_SIZE) {
        uc->qemu_host_page_size = TARGET_PAGE_SIZE;
    }
}